

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

void __thiscall
google::protobuf::MergedDescriptorDatabase::MergedDescriptorDatabase
          (MergedDescriptorDatabase *this,DescriptorDatabase *source1,DescriptorDatabase *source2)

{
  pointer *pppDVar1;
  iterator __position;
  DescriptorDatabase *local_30;
  DescriptorDatabase *source1_local;
  DescriptorDatabase *source2_local;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__MergedDescriptorDatabase_003ba7f8;
  (this->sources_).
  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sources_).
  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = source1;
  source1_local = source2;
  std::
  vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
  ::_M_realloc_insert<google::protobuf::DescriptorDatabase*const&>
            ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
              *)&this->sources_,(iterator)0x0,&local_30);
  __position._M_current =
       (this->sources_).
       super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->sources_).
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
    ::_M_realloc_insert<google::protobuf::DescriptorDatabase*const&>
              ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
                *)&this->sources_,__position,&source1_local);
  }
  else {
    *__position._M_current = source2;
    pppDVar1 = &(this->sources_).
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  return;
}

Assistant:

MergedDescriptorDatabase::MergedDescriptorDatabase(
    DescriptorDatabase* source1, DescriptorDatabase* source2) {
  sources_.push_back(source1);
  sources_.push_back(source2);
}